

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void log_secret(ptls_t *tls,char *type,ptls_iovec_t secret)

{
  byte bVar1;
  st_ptls_log_event_t *psVar2;
  char *pcVar3;
  size_t sVar4;
  char hexbuf [129];
  char local_98 [144];
  
  psVar2 = tls->ctx->log_event;
  if (psVar2 != (st_ptls_log_event_t *)0x0) {
    pcVar3 = local_98;
    if (secret.len != 0) {
      sVar4 = 0;
      pcVar3 = local_98;
      do {
        bVar1 = secret.base[sVar4];
        *pcVar3 = "0123456789abcdef0123456789abcdef0123456789abcdef"[(ulong)(bVar1 >> 4) + 0x20];
        pcVar3[1] = "0123456789abcdef0123456789abcdef0123456789abcdef"[(ulong)(bVar1 & 0xf) + 0x20];
        pcVar3 = pcVar3 + 2;
        sVar4 = sVar4 + 1;
      } while (secret.len != sVar4);
    }
    *pcVar3 = '\0';
    (*psVar2->cb)(psVar2,tls,type,"%s",local_98);
  }
  return;
}

Assistant:

static void log_secret(ptls_t *tls, const char *type, ptls_iovec_t secret)
{
    if (tls->ctx->log_event != NULL) {
        char hexbuf[PTLS_MAX_DIGEST_SIZE * 2 + 1];
        ptls_hexdump(hexbuf, secret.base, secret.len);
        tls->ctx->log_event->cb(tls->ctx->log_event, tls, type, "%s", hexbuf);
    }
}